

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::
Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
findBucketWithHash<QtPrivate::QModelIndexWrapper>
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *this,QModelIndexWrapper *key,size_t hash)

{
  Span *pSVar1;
  bool bVar2;
  Span *pSVar3;
  Span *pSVar4;
  ulong uVar5;
  long lVar6;
  Bucket BVar7;
  
  pSVar1 = *(Span **)(this + 0x20);
  uVar5 = *(ulong *)(this + 0x10) - 1 & hash;
  pSVar3 = pSVar1 + (uVar5 >> 7) * 0x90;
  uVar5 = (ulong)((uint)uVar5 & 0x7f);
  do {
    if (pSVar3[uVar5] == (Span)0xff) {
LAB_0055ad31:
      bVar2 = false;
    }
    else {
      lVar6 = (ulong)(byte)pSVar3[uVar5] * 0x20;
      if ((((*(int *)(*(long *)(pSVar3 + 0x80) + lVar6) == (key->index).r) &&
           (lVar6 = *(long *)(pSVar3 + 0x80) + lVar6, *(int *)(lVar6 + 4) == (key->index).c)) &&
          (*(quintptr *)(lVar6 + 8) == (key->index).i)) &&
         (*(QAbstractItemModel **)(lVar6 + 0x10) == (key->index).m.ptr)) goto LAB_0055ad31;
      uVar5 = uVar5 + 1;
      bVar2 = true;
      if (uVar5 == 0x80) {
        pSVar4 = pSVar3 + 0x90;
        pSVar3 = pSVar1;
        if (((long)pSVar4 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 -
            (*(ulong *)(this + 0x10) >> 7) != 0) {
          pSVar3 = pSVar4;
        }
        uVar5 = 0;
      }
    }
    if (!bVar2) {
      BVar7.index = uVar5;
      BVar7.span = pSVar3;
      return BVar7;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }